

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O1

ColMatrix * __thiscall fizplex::Base::get_inverse(ColMatrix *__return_storage_ptr__,Base *this)

{
  pointer pEVar1;
  pointer pNVar2;
  unsigned_long *puVar3;
  SVector *pSVar4;
  Nonzero *n;
  pointer pNVar5;
  ulong uVar6;
  size_t sVar7;
  
  ColMatrix::identity(__return_storage_ptr__,this->m);
  if (this->m != 0) {
    uVar6 = 0;
    do {
      if (this->m != 0) {
        sVar7 = 0;
        do {
          pEVar1 = (this->etms).
                   super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar4 = ColMatrix::column(__return_storage_ptr__,sVar7);
          apply_etm(this,pEVar1 + uVar6,pSVar4);
          sVar7 = sVar7 + 1;
        } while (sVar7 < this->m);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->m);
  }
  if (this->m != 0) {
    sVar7 = 0;
    do {
      pSVar4 = ColMatrix::column(__return_storage_ptr__,sVar7);
      pNVar5 = (pSVar4->values).
               super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pNVar2 = (pSVar4->values).
               super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pNVar5 != pNVar2) {
        puVar3 = (this->row_ordering)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        do {
          pNVar5->index = puVar3[pNVar5->index];
          pNVar5 = pNVar5 + 1;
        } while (pNVar5 != pNVar2);
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 < this->m);
  }
  return __return_storage_ptr__;
}

Assistant:

ColMatrix Base::get_inverse() {
  auto inv = ColMatrix::identity(m);
  for (size_t ind = 0; ind < m; ++ind) {
    for (size_t i = 0; i < m; ++i)
      apply_etm(etms[ind], inv.column(i));
  }

  for (size_t col = 0; col < m; ++col) {
    for (auto &n : inv.column(col))
      n.index = row_ordering[n.index];
  }
  return inv;
}